

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_credits.hpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
PatchCredits::build_credits_bytes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          PatchCredits *this)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  reference pvVar1;
  size_type sVar2;
  size_type sVar3;
  LandstalkerException *this_00;
  allocator<char> local_219;
  string local_218;
  int local_1f4;
  uchar *local_1f0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1e8;
  uchar *local_1e0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1d8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1d0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1c8;
  const_iterator local_1c0;
  uchar *local_1b8;
  uchar *local_1b0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1a8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1a0;
  const_iterator local_198;
  allocator<unsigned_char> local_18d;
  uchar local_18c [140];
  iterator local_100;
  size_type local_f8;
  undefined1 local_f0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> rando_credits;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_d0;
  uchar *local_c8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_c0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_b8;
  allocator<unsigned_char> local_a9;
  uchar local_a8 [32];
  iterator local_88;
  size_type local_80;
  undefined1 local_78 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> landstalker_randomizer;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_48;
  uchar *local_40;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_38;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_30;
  const_iterator local_28;
  byte local_19;
  PatchCredits *local_18;
  PatchCredits *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *new_credits_text;
  
  local_19 = 0;
  local_18 = this;
  this_local = (PatchCredits *)__return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  local_30._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          (__return_storage_ptr__);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_28,&local_30);
  local_38._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          (&this->_original_credits);
  local_48._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          (&this->_original_credits);
  local_40 = (uchar *)__gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+(&local_48,0x75);
  landstalker_randomizer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                          ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                           __return_storage_ptr__,local_28,local_38,
                           (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )local_40);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (__return_storage_ptr__,2);
  *pvVar1 = '\x13';
  builtin_memcpy(local_a8 + 0x10,"*($5 -",6);
  local_a8[0] = '\'';
  local_a8[1] = '\x1c';
  local_a8[2] = ')';
  local_a8[3] = '\x1f';
  local_a8[4] = '.';
  local_a8[5] = '/';
  local_a8[6] = '\x1c';
  local_a8[7] = '\'';
  local_a8[8] = '&';
  local_a8[9] = ' ';
  local_a8[10] = '-';
  local_a8[0xb] = 0x80;
  local_a8[0xc] = '-';
  local_a8[0xd] = '\x1c';
  local_a8[0xe] = ')';
  local_a8[0xf] = '\x1f';
  local_88 = local_a8;
  local_80 = 0x16;
  std::allocator<unsigned_char>::allocator(&local_a9);
  __l_00._M_len = local_80;
  __l_00._M_array = local_88;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,__l_00,&local_a9);
  std::allocator<unsigned_char>::~allocator(&local_a9);
  local_b8._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
  local_c0._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
  local_d0._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          (__return_storage_ptr__);
  local_c8 = (uchar *)__gnu_cxx::
                      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+(&local_d0,0x14);
  rando_credits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          (local_b8,local_c0,
                           (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )local_c8);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (__return_storage_ptr__,0x5c);
  *pvVar1 = '\x0f';
  memcpy(local_18c,&DAT_0031ad4a,0x8c);
  local_f8 = 0x8c;
  local_100 = local_18c;
  std::allocator<unsigned_char>::allocator(&local_18d);
  __l._M_len = local_f8;
  __l._M_array = local_100;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0,__l,&local_18d);
  std::allocator<unsigned_char>::~allocator(&local_18d);
  local_1a0._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          (__return_storage_ptr__);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_198,&local_1a0);
  local_1a8._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0);
  local_1b0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0)
  ;
  local_1b8 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                       insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                 ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                                  __return_storage_ptr__,local_198,local_1a8,
                                  (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                   )local_1b0);
  local_1c8._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          (__return_storage_ptr__);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_1c0,&local_1c8);
  local_1d8._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          (&this->_original_credits);
  local_1d0 = __gnu_cxx::
              __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator+(&local_1d8,0x1d3);
  local_1e8._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          (&this->_original_credits);
  local_1e0 = (uchar *)__gnu_cxx::
                       __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       ::operator+(&local_1e8,0x929);
  local_1f0 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                       insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                 ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                                  __return_storage_ptr__,local_1c0,local_1d0,
                                  (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                   )local_1e0);
  while( true ) {
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(__return_storage_ptr__)
    ;
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      (&this->_original_credits);
    if (sVar3 <= sVar2) break;
    local_1f4 = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<int>
              (__return_storage_ptr__,&local_1f4);
  }
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(__return_storage_ptr__);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_original_credits)
  ;
  if (sVar3 < sVar2) {
    this_00 = (LandstalkerException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,"New credits cannot be bigger than original credits",&local_219)
    ;
    LandstalkerException::LandstalkerException(this_00,&local_218);
    __cxa_throw(this_00,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException)
    ;
  }
  local_19 = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
  if ((local_19 & 1) == 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::vector<uint8_t> build_credits_bytes() const
    {
        std::vector<uint8_t> new_credits_text;

        new_credits_text.insert(new_credits_text.begin(), _original_credits.begin(), _original_credits.begin() + 0x75);

        // Change "LANDSTALKER" to "RANDSTALKER"
        new_credits_text[0x2] = 0x13;

        std::vector<uint8_t> landstalker_randomizer = {
                0x27, 0x1C, 0x29, 0x1F, 0x2E, 0x2F, 0x1C, 0x27, 0x26, 0x20, 0x2D, 0x80, // "landstalker "
                0x2D, 0x1C, 0x29, 0x1F, 0x2A, 0x28, 0x24, 0x35, 0x20, 0x2D              // "randomizer"
        };
        std::copy(landstalker_randomizer.begin(), landstalker_randomizer.end(), new_credits_text.begin() + 0x14);

        // Widen the space between the end of the cast and the beginning of the rando staff
        new_credits_text[0x5C] = 0x0F;

        // Replace the "game cast" (useless list of game characters) by the randomizer credits
        std::vector<uint8_t> rando_credits = {
                // " R A N D O M I Z E R "
                0x08, 0xFF, 0x82,
                0x80, 0x13, 0x80, 0x02, 0x80, 0x0F, 0x80, 0x05, 0x80, 0x10, 0x80, 0x0E, 0x80, 0x0A, 0x80, 0x1B, 0x80, 0x06, 0x80, 0x13, 0x80, 0x00,
                // "developed by"
                0x04, 0xFF, 0x81,
                0x1F, 0x20, 0x31, 0x20, 0x27, 0x2A, 0x2B, 0x20, 0x1F, 0x80, 0x1D, 0x34, 0x00,
                // "DINOPONY"
                0x03, 0xFF,
                0x05, 0x0A, 0x0F, 0x10, 0x11, 0x10, 0x0F, 0x1A, 0x00,
                // "WIZ"
                0x08, 0xFF,
                0x18, 0x0A, 0x1B, 0x00,
                // "testing"
                0x04, 0xFF, 0x81,
                0x2F, 0x20, 0x2E, 0x2F, 0x24, 0x29, 0x22, 0x00,
                // "SAGAZ"
                0x03, 0xFF,
                0x14, 0x02, 0x08, 0x02, 0x1B, 0x00,
                // "STIK"
                0x03, 0xFF,
                0x14, 0x15, 0x0A, 0x0C, 0x00,
                // "HAWKREX"
                0x03, 0xFF,
                0x09, 0x02, 0x18, 0x0C, 0x13, 0x06, 0x19, 0x00,
                // "LANDRYLE"
                0x03, 0xFF,
                0x0D, 0x02, 0x0F, 0x05, 0x13, 0x1A, 0x0D, 0x06, 0x00,
                // "SORCIER"
                0x08, 0xFF,
                0x14, 0x10, 0x13, 0x04, 0x0A, 0x06, 0x13, 0x00,
                // "disassembly"
                0x04, 0xFF, 0x81,
                0x1F, 0x24, 0x2E, 0x1C, 0x2E, 0x2E, 0x20, 0x28, 0x1D, 0x27, 0x34, 0x00,
                // "LORDMIR"
                0x08, 0xFF,
                0x0D, 0x10, 0x13, 0x05, 0x0E, 0x0A, 0x13, 0x00,
        };
        new_credits_text.insert(new_credits_text.end(), rando_credits.begin(), rando_credits.end());

        // Add the rest of the original game credits
        new_credits_text.insert(new_credits_text.end(), _original_credits.begin() + 0x1D3, _original_credits.begin() + 0x929);

        while(new_credits_text.size() < _original_credits.size())
            new_credits_text.emplace_back(0x00);
        if(new_credits_text.size() > _original_credits.size())
            throw LandstalkerException("New credits cannot be bigger than original credits");

        return new_credits_text;
    }